

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O3

void Hacl_GenericField32_exp_consttime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  uint32_t *puVar1;
  size_t __n;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  byte bVar7;
  sbyte sVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint uVar14;
  uint32_t *puVar15;
  uint32_t *puVar16;
  uint uVar17;
  uint32_t *os_15;
  uint32_t *puVar18;
  ulong uVar19;
  uint32_t *puVar20;
  uint32_t auStack_110 [2];
  ulong local_108;
  uint32_t *local_100;
  uint32_t *ctx_r2;
  uint32_t *local_f0;
  uint32_t *local_e8;
  uint32_t *local_e0;
  uint32_t *local_d8;
  uint32_t *local_d0;
  uint32_t *local_c8;
  uint32_t *local_c0;
  uint32_t *local_b8;
  uint32_t *local_b0;
  uint32_t *local_a8;
  uint32_t *local_a0;
  uint local_94;
  uint32_t *local_90;
  uint32_t *local_88;
  uint32_t *local_80;
  ulong local_78;
  ulong local_70;
  uint32_t *local_68;
  uint32_t *local_60;
  uint32_t *local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *ctx_n;
  uint32_t *os;
  
  uVar17 = k->len;
  uVar19 = (ulong)uVar17;
  local_68 = k->n;
  uVar6 = k->mu;
  local_50 = k->r2;
  local_70 = uVar19 * 4 + 0xf & 0xfffffffffffffff0;
  puVar20 = (uint32_t *)((long)&local_108 + -local_70);
  __n = uVar19 * 4;
  local_e8 = b;
  ctx_n = resM;
  *(undefined8 *)((long)auStack_110 + -local_70) = 0x13ed4a;
  memcpy(puVar20,aM,__n);
  local_78 = (ulong)bBits;
  os._4_4_ = uVar6;
  if (bBits < 200) {
    puVar16 = (uint32_t *)((long)puVar20 - ((ulong)(uVar17 * 2) * 4 + 0xf & 0xfffffffffffffff0));
    puVar16[-2] = 0x13ed85;
    puVar16[-1] = 0;
    memset(puVar16,0,(ulong)(uVar17 * 2) << 2);
    puVar1 = local_68;
    puVar16[-2] = 0x13ed94;
    puVar16[-1] = 0;
    memcpy(puVar16,puVar1,__n);
    puVar1 = local_50;
    local_60 = puVar16 + uVar19;
    puVar16[-2] = 0x13eda8;
    puVar16[-1] = 0;
    memcpy(puVar16 + uVar19,puVar1,__n);
    puVar13 = ctx_n;
    puVar1 = local_60;
    local_58 = puVar16;
    puVar16[-2] = 0x13edc1;
    puVar16[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar17,puVar16,uVar6,puVar1,puVar13);
    uVar6 = os._4_4_;
    puVar1 = ctx_n;
    uVar10 = 0;
    if ((int)local_78 != 0) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        local_48 = (uint32_t *)CONCAT44(local_48._4_4_,uVar9);
        uVar9 = ~uVar9 + (int)local_78;
        uVar9 = (uint)((local_e8[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0);
        if (uVar19 != 0) {
          uVar11 = 0;
          do {
            uVar3 = puVar20[uVar11];
            uVar14 = (uVar3 ^ ctx_n[uVar11]) & -(uVar10 ^ uVar9);
            ctx_n[uVar11] = ctx_n[uVar11] ^ uVar14;
            puVar20[uVar11] = uVar14 ^ uVar3;
            uVar11 = uVar11 + 1;
          } while (uVar19 != uVar11);
        }
        puVar13 = local_58;
        local_60 = (uint32_t *)CONCAT44(local_60._4_4_,uVar9);
        puVar16[-2] = 0x13ee4e;
        puVar16[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar13,uVar6,puVar20,puVar1,puVar20);
        puVar16[-2] = 0x13ee64;
        puVar16[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar13,uVar6,puVar1,puVar1);
        uVar9 = (int)local_48 + 1;
        uVar10 = (uint)local_60;
      } while (uVar9 != (uint)local_78);
    }
    if (uVar19 != 0) {
      uVar11 = 0;
      do {
        uVar17 = puVar20[uVar11];
        uVar9 = (uVar17 ^ ctx_n[uVar11]) & -uVar10;
        ctx_n[uVar11] = ctx_n[uVar11] ^ uVar9;
        puVar20[uVar11] = uVar9 ^ uVar17;
        uVar11 = uVar11 + 1;
      } while (uVar19 != uVar11);
    }
  }
  else {
    local_94 = bBits - 1 >> 5;
    local_60 = (uint32_t *)(ulong)(uVar17 * 2);
    puVar13 = (uint32_t *)((long)puVar20 - ((long)local_60 * 4 + 0xfU & 0xfffffffffffffff0));
    sVar2 = (long)local_60 * 4;
    puVar13[-2] = 0x13eef1;
    puVar13[-1] = 0;
    memset(puVar13,0,sVar2);
    puVar1 = local_68;
    puVar13[-2] = 0x13ef00;
    puVar13[-1] = 0;
    memcpy(puVar13,puVar1,__n);
    puVar1 = local_50;
    local_100 = puVar13 + uVar19;
    local_48 = puVar13;
    puVar13[-2] = 0x13ef1b;
    puVar13[-1] = 0;
    memcpy(puVar13 + uVar19,puVar1,__n);
    local_a8 = (uint32_t *)(ulong)(uVar17 << 4);
    sVar2 = (long)local_a8 * 4;
    puVar15 = puVar13 + -(long)local_a8;
    puVar15[-2] = 0x13ef43;
    puVar15[-1] = 0;
    memset(puVar15,0,sVar2);
    puVar18 = (uint32_t *)((long)puVar15 - local_70);
    local_58 = (uint32_t *)__n;
    puVar18[-2] = 0x13ef5e;
    puVar18[-1] = 0;
    memset(puVar18,0,__n);
    uVar6 = os._4_4_;
    puVar1 = local_100;
    local_68 = puVar15 + uVar19;
    local_50 = puVar15;
    puVar18[-2] = 0x13ef84;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar17,puVar13,uVar6,puVar1,puVar15);
    puVar16 = local_58;
    puVar18[-2] = 0x13ef96;
    puVar18[-1] = 0;
    memcpy(puVar15 + uVar19,puVar20,(size_t)puVar16);
    puVar13 = local_48;
    puVar1 = local_68;
    puVar18[-2] = 0x13efab;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar13,uVar6,puVar1,puVar18);
    puVar13 = local_50;
    puVar1 = local_50 + (long)local_60;
    local_b8 = puVar1;
    puVar18[-2] = 0x13efc9;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar16);
    uVar6 = os._4_4_;
    puVar16 = local_48;
    puVar1 = local_b8;
    puVar18[-2] = 0x13efe9;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar16,uVar6,puVar20,puVar1,puVar18);
    puVar1 = local_58;
    local_a0 = (uint32_t *)(ulong)(uVar17 * 3);
    puVar13 = puVar13 + (long)local_a0;
    local_e0 = puVar13;
    puVar18[-2] = 0x13f00b;
    puVar18[-1] = 0;
    memcpy(puVar13,puVar18,(size_t)puVar1);
    puVar16 = local_48;
    puVar1 = local_b8;
    puVar18[-2] = 0x13f027;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar16,uVar6,puVar1,puVar18);
    puVar13 = local_58;
    local_80 = (uint32_t *)(ulong)(uVar17 * 4);
    puVar1 = local_50 + (long)local_80;
    local_b0 = puVar1;
    puVar18[-2] = 0x13f051;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar1 = local_b0;
    puVar18[-2] = 0x13f06e;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar16,uVar6,puVar20,puVar1,puVar18);
    local_90 = (uint32_t *)(ulong)(uVar17 * 5);
    puVar1 = local_50 + (long)local_90;
    local_d8 = puVar1;
    puVar18[-2] = 0x13f093;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    puVar13 = local_48;
    puVar1 = local_e0;
    puVar18[-2] = 0x13f0ab;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar13,uVar6,puVar1,puVar18);
    puVar16 = local_50;
    puVar13 = local_58;
    puVar1 = local_50 + (uint)((int)local_60 * 3);
    local_d0 = puVar1;
    puVar18[-2] = 0x13f0d0;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar13 = local_48;
    puVar18[-2] = 0x13f0e8;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar13,uVar6,puVar20,puVar1,puVar18);
    puVar1 = local_58;
    local_88 = (uint32_t *)(ulong)(uVar17 * 8);
    local_c8 = puVar16 + uVar17 * 7;
    puVar18[-2] = 0x13f10e;
    puVar18[-1] = 0;
    memcpy(puVar16 + uVar17 * 7,puVar18,(size_t)puVar1);
    uVar6 = os._4_4_;
    puVar16 = local_48;
    puVar1 = local_b0;
    puVar18[-2] = 0x13f12e;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar16,uVar6,puVar1,puVar18);
    puVar13 = local_58;
    puVar1 = local_50 + (long)local_88;
    local_88 = puVar1;
    puVar18[-2] = 0x13f14a;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    puVar1 = local_88;
    puVar18[-2] = 0x13f162;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar16,uVar6,puVar20,puVar1,puVar18);
    puVar16 = local_50;
    puVar13 = local_58;
    puVar1 = local_50 + uVar17 * 9;
    ctx_r2 = puVar1;
    puVar18[-2] = 0x13f184;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar15 = local_48;
    puVar1 = local_d8;
    puVar18[-2] = 0x13f19d;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar15,uVar6,puVar1,puVar18);
    iVar4 = (int)local_60;
    local_c0 = puVar16 + (uint)(iVar4 * 5);
    puVar18[-2] = 0x13f1ba;
    puVar18[-1] = 0;
    memcpy(puVar16 + (uint)(iVar4 * 5),puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar13 = local_48;
    puVar1 = local_c0;
    puVar18[-2] = 0x13f1d8;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar13,uVar6,puVar20,puVar1,puVar18);
    puVar16 = local_50;
    puVar13 = local_58;
    puVar1 = local_50 + (uVar17 + (int)local_90 * 2);
    local_f0 = puVar1;
    puVar18[-2] = 0x13f1fe;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    puVar13 = local_48;
    puVar1 = local_d0;
    puVar18[-2] = 0x13f216;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar13,uVar6,puVar1,puVar18);
    puVar13 = local_58;
    iVar4 = (int)local_80;
    local_80 = puVar16 + (uint)(iVar4 * 3);
    puVar18[-2] = 0x13f234;
    puVar18[-1] = 0;
    memcpy(puVar16 + (uint)(iVar4 * 3),puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar16 = local_48;
    puVar1 = local_80;
    puVar18[-2] = 0x13f251;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar16,uVar6,puVar20,puVar1,puVar18);
    puVar1 = local_50 + (uVar17 + (int)local_a0 * 4);
    local_a0 = puVar1;
    puVar18[-2] = 0x13f276;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    puVar13 = local_48;
    puVar1 = local_c8;
    puVar18[-2] = 0x13f28f;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar13,uVar6,puVar1,puVar18);
    puVar13 = local_58;
    puVar1 = local_50 + ((int)local_a8 - (uint)local_60);
    puVar18[-2] = 0x13f2b3;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar16 = local_48;
    local_a8 = puVar1;
    puVar18[-2] = 0x13f2d2;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar16,uVar6,puVar20,puVar1,puVar18);
    puVar20 = local_50 + (uint)((int)local_90 * 3);
    local_90 = puVar20;
    puVar18[-2] = 0x13f2f6;
    puVar18[-1] = 0;
    memcpy(puVar20,puVar18,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar15 = ctx_n;
    puVar16 = local_48;
    puVar13 = local_50;
    puVar1 = local_58;
    uVar11 = local_70;
    puVar20 = local_100;
    if ((local_78 & 3) == 0) {
      puVar18[-2] = 0x13f735;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar17,puVar16,uVar6,puVar20,puVar15);
      uVar11 = local_70;
    }
    else {
      uVar12 = local_78 >> 5 & 0x7ffffff;
      bVar7 = (byte)local_78 & 0x1c;
      uVar17 = local_e8[uVar12] >> bVar7;
      if ((local_78 & 0x1c) != 0 && (uint)uVar12 < local_94) {
        uVar17 = uVar17 | local_e8[uVar12 + 1] << (-bVar7 & 0x1f);
      }
      uVar17 = uVar17 & 0xf;
      puVar18[-2] = 0x13f35a;
      puVar18[-1] = 0;
      memcpy(puVar15,puVar13,(size_t)puVar1);
      puVar18[-2] = 0x13f367;
      puVar18[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar17,1);
      if (uVar19 != 0) {
        uVar12 = 0;
        do {
          ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_68[uVar12] & uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar19 != uVar12);
        puVar18[-2] = 0x13f3a5;
        puVar18[-1] = 0;
        uVar5 = FStar_UInt32_eq_mask(uVar17,2);
        if (uVar19 != 0) {
          uVar12 = 0;
          do {
            ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_b8[uVar12] & uVar5;
            uVar12 = uVar12 + 1;
          } while (uVar19 != uVar12);
          puVar18[-2] = 0x13f3e6;
          puVar18[-1] = 0;
          uVar5 = FStar_UInt32_eq_mask(uVar17,3);
          if (uVar19 != 0) {
            uVar12 = 0;
            do {
              ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_e0[uVar12] & uVar5;
              uVar12 = uVar12 + 1;
            } while (uVar19 != uVar12);
            puVar18[-2] = 0x13f427;
            puVar18[-1] = 0;
            uVar5 = FStar_UInt32_eq_mask(uVar17,4);
            if (uVar19 != 0) {
              uVar12 = 0;
              do {
                ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_b0[uVar12] & uVar5;
                uVar12 = uVar12 + 1;
              } while (uVar19 != uVar12);
              puVar18[-2] = 0x13f468;
              puVar18[-1] = 0;
              uVar5 = FStar_UInt32_eq_mask(uVar17,5);
              if (uVar19 != 0) {
                uVar12 = 0;
                do {
                  ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_d8[uVar12] & uVar5;
                  uVar12 = uVar12 + 1;
                } while (uVar19 != uVar12);
                puVar18[-2] = 0x13f4a9;
                puVar18[-1] = 0;
                uVar5 = FStar_UInt32_eq_mask(uVar17,6);
                if (uVar19 != 0) {
                  uVar12 = 0;
                  do {
                    ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_d0[uVar12] & uVar5;
                    uVar12 = uVar12 + 1;
                  } while (uVar19 != uVar12);
                  puVar18[-2] = 0x13f4ea;
                  puVar18[-1] = 0;
                  uVar5 = FStar_UInt32_eq_mask(uVar17,7);
                  if (uVar19 != 0) {
                    uVar12 = 0;
                    do {
                      ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_c8[uVar12] & uVar5;
                      uVar12 = uVar12 + 1;
                    } while (uVar19 != uVar12);
                    puVar18[-2] = 0x13f52b;
                    puVar18[-1] = 0;
                    uVar5 = FStar_UInt32_eq_mask(uVar17,8);
                    if (uVar19 != 0) {
                      uVar12 = 0;
                      do {
                        ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_88[uVar12] & uVar5;
                        uVar12 = uVar12 + 1;
                      } while (uVar19 != uVar12);
                      puVar18[-2] = 0x13f569;
                      puVar18[-1] = 0;
                      uVar5 = FStar_UInt32_eq_mask(uVar17,9);
                      if (uVar19 != 0) {
                        uVar12 = 0;
                        do {
                          ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | ctx_r2[uVar12] & uVar5;
                          uVar12 = uVar12 + 1;
                        } while (uVar19 != uVar12);
                        puVar18[-2] = 0x13f5aa;
                        puVar18[-1] = 0;
                        uVar5 = FStar_UInt32_eq_mask(uVar17,10);
                        if (uVar19 != 0) {
                          uVar12 = 0;
                          do {
                            ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_c0[uVar12] & uVar5;
                            uVar12 = uVar12 + 1;
                          } while (uVar19 != uVar12);
                          puVar18[-2] = 0x13f5eb;
                          puVar18[-1] = 0;
                          uVar5 = FStar_UInt32_eq_mask(uVar17,0xb);
                          if (uVar19 != 0) {
                            uVar12 = 0;
                            do {
                              ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_f0[uVar12] & uVar5;
                              uVar12 = uVar12 + 1;
                            } while (uVar19 != uVar12);
                            puVar18[-2] = 0x13f62c;
                            puVar18[-1] = 0;
                            uVar5 = FStar_UInt32_eq_mask(uVar17,0xc);
                            if (uVar19 != 0) {
                              uVar12 = 0;
                              do {
                                ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_80[uVar12] & uVar5;
                                uVar12 = uVar12 + 1;
                              } while (uVar19 != uVar12);
                              puVar18[-2] = 0x13f66a;
                              puVar18[-1] = 0;
                              uVar5 = FStar_UInt32_eq_mask(uVar17,0xd);
                              if (uVar19 != 0) {
                                uVar12 = 0;
                                do {
                                  ctx_n[uVar12] = ctx_n[uVar12] & ~uVar5 | local_a0[uVar12] & uVar5;
                                  uVar12 = uVar12 + 1;
                                } while (uVar19 != uVar12);
                                puVar18[-2] = 0x13f6ab;
                                puVar18[-1] = 0;
                                uVar5 = FStar_UInt32_eq_mask(uVar17,0xe);
                                if (uVar19 != 0) {
                                  uVar12 = 0;
                                  do {
                                    ctx_n[uVar12] =
                                         ctx_n[uVar12] & ~uVar5 | local_a8[uVar12] & uVar5;
                                    uVar12 = uVar12 + 1;
                                  } while (uVar19 != uVar12);
                                  puVar18[-2] = 0x13f6ec;
                                  puVar18[-1] = 0;
                                  uVar5 = FStar_UInt32_eq_mask(uVar17,0xf);
                                  if (uVar19 != 0) {
                                    uVar12 = 0;
                                    do {
                                      ctx_n[uVar12] =
                                           ctx_n[uVar12] & ~uVar5 | local_90[uVar12] & uVar5;
                                      uVar12 = uVar12 + 1;
                                    } while (uVar19 != uVar12);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    puVar20 = local_58;
    puVar18 = (uint32_t *)((long)puVar18 - uVar11);
    uVar12 = 0;
    puVar18[-2] = 0x13f753;
    puVar18[-1] = 0;
    memset(puVar18,0,(size_t)puVar20);
    uVar11 = local_78 >> 2;
    local_78 = (ulong)((uint)local_78 & 0xfffffffc);
    local_70 = CONCAT44(local_70._4_4_,
                        ((uint)uVar11 & 0x3fffffff) + (uint)((uVar11 & 0x3fffffff) == 0));
    puVar20 = local_48;
    local_108 = uVar19;
    do {
      puVar1 = ctx_n;
      local_60 = (uint32_t *)uVar12;
      puVar18[-2] = 0x13f798;
      puVar18[-1] = 0;
      uVar5 = (uint32_t)uVar19;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar20,uVar6,puVar1,puVar1);
      puVar18[-2] = 0x13f7ab;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar20,uVar6,puVar1,puVar1);
      puVar18[-2] = 0x13f7be;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar20,uVar6,puVar1,puVar1);
      puVar18[-2] = 0x13f7d1;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar5,puVar20,uVar6,puVar1,puVar1);
      puVar1 = local_50;
      puVar20 = local_58;
      uVar10 = ((int)local_78 + (int)local_60 * -4) - 4;
      uVar17 = uVar10 >> 5;
      uVar10 = uVar10 & 0x1c;
      sVar8 = (sbyte)uVar10;
      uVar9 = local_e8[uVar17] >> sVar8;
      if (uVar10 != 0 && uVar17 < local_94) {
        uVar9 = uVar9 | local_e8[(ulong)uVar17 + 1] << (-sVar8 & 0x1fU);
      }
      uVar9 = uVar9 & 0xf;
      puVar18[-2] = 0x13f82e;
      puVar18[-1] = 0;
      memcpy(puVar18,puVar1,(size_t)puVar20);
      puVar18[-2] = 0x13f83b;
      puVar18[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar9,1);
      puVar20 = local_68;
      uVar19 = local_108;
      if (local_108 != 0) {
        uVar11 = 0;
        do {
          puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
          uVar11 = uVar11 + 1;
        } while (uVar19 != uVar11);
        puVar18[-2] = 0x13f87e;
        puVar18[-1] = 0;
        uVar6 = FStar_UInt32_eq_mask(uVar9,2);
        puVar20 = local_b8;
        if (uVar19 != 0) {
          uVar11 = 0;
          do {
            puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
            uVar11 = uVar11 + 1;
          } while (uVar19 != uVar11);
          puVar18[-2] = 0x13f8bd;
          puVar18[-1] = 0;
          uVar6 = FStar_UInt32_eq_mask(uVar9,3);
          puVar20 = local_e0;
          if (uVar19 != 0) {
            uVar11 = 0;
            do {
              puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
              uVar11 = uVar11 + 1;
            } while (uVar19 != uVar11);
            puVar18[-2] = 0x13f8fc;
            puVar18[-1] = 0;
            uVar6 = FStar_UInt32_eq_mask(uVar9,4);
            puVar20 = local_b0;
            if (uVar19 != 0) {
              uVar11 = 0;
              do {
                puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                uVar11 = uVar11 + 1;
              } while (uVar19 != uVar11);
              puVar18[-2] = 0x13f93b;
              puVar18[-1] = 0;
              uVar6 = FStar_UInt32_eq_mask(uVar9,5);
              puVar20 = local_d8;
              if (uVar19 != 0) {
                uVar11 = 0;
                do {
                  puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                  uVar11 = uVar11 + 1;
                } while (uVar19 != uVar11);
                puVar18[-2] = 0x13f97a;
                puVar18[-1] = 0;
                uVar6 = FStar_UInt32_eq_mask(uVar9,6);
                puVar20 = local_d0;
                if (uVar19 != 0) {
                  uVar11 = 0;
                  do {
                    puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                    uVar11 = uVar11 + 1;
                  } while (uVar19 != uVar11);
                  puVar18[-2] = 0x13f9b9;
                  puVar18[-1] = 0;
                  uVar6 = FStar_UInt32_eq_mask(uVar9,7);
                  puVar20 = local_c8;
                  if (uVar19 != 0) {
                    uVar11 = 0;
                    do {
                      puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                      uVar11 = uVar11 + 1;
                    } while (uVar19 != uVar11);
                    puVar18[-2] = 0x13f9f8;
                    puVar18[-1] = 0;
                    uVar6 = FStar_UInt32_eq_mask(uVar9,8);
                    puVar20 = local_88;
                    if (uVar19 != 0) {
                      uVar11 = 0;
                      do {
                        puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                        uVar11 = uVar11 + 1;
                      } while (uVar19 != uVar11);
                      puVar18[-2] = 0x13fa34;
                      puVar18[-1] = 0;
                      uVar6 = FStar_UInt32_eq_mask(uVar9,9);
                      puVar20 = ctx_r2;
                      if (uVar19 != 0) {
                        uVar11 = 0;
                        do {
                          puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                          uVar11 = uVar11 + 1;
                        } while (uVar19 != uVar11);
                        puVar18[-2] = 0x13fa73;
                        puVar18[-1] = 0;
                        uVar6 = FStar_UInt32_eq_mask(uVar9,10);
                        puVar20 = local_c0;
                        if (uVar19 != 0) {
                          uVar11 = 0;
                          do {
                            puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                            uVar11 = uVar11 + 1;
                          } while (uVar19 != uVar11);
                          puVar18[-2] = 0x13fab2;
                          puVar18[-1] = 0;
                          uVar6 = FStar_UInt32_eq_mask(uVar9,0xb);
                          puVar20 = local_f0;
                          if (uVar19 != 0) {
                            uVar11 = 0;
                            do {
                              puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                              uVar11 = uVar11 + 1;
                            } while (uVar19 != uVar11);
                            puVar18[-2] = 0x13faf1;
                            puVar18[-1] = 0;
                            uVar6 = FStar_UInt32_eq_mask(uVar9,0xc);
                            puVar20 = local_80;
                            if (uVar19 != 0) {
                              uVar11 = 0;
                              do {
                                puVar18[uVar11] = puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6
                                ;
                                uVar11 = uVar11 + 1;
                              } while (uVar19 != uVar11);
                              puVar18[-2] = 0x13fb2d;
                              puVar18[-1] = 0;
                              uVar6 = FStar_UInt32_eq_mask(uVar9,0xd);
                              puVar20 = local_a0;
                              if (uVar19 != 0) {
                                uVar11 = 0;
                                do {
                                  puVar18[uVar11] =
                                       puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                                  uVar11 = uVar11 + 1;
                                } while (uVar19 != uVar11);
                                puVar18[-2] = 0x13fb6c;
                                puVar18[-1] = 0;
                                uVar6 = FStar_UInt32_eq_mask(uVar9,0xe);
                                puVar20 = local_a8;
                                if (uVar19 != 0) {
                                  uVar11 = 0;
                                  do {
                                    puVar18[uVar11] =
                                         puVar18[uVar11] & ~uVar6 | puVar20[uVar11] & uVar6;
                                    uVar11 = uVar11 + 1;
                                  } while (uVar19 != uVar11);
                                  puVar18[-2] = 0x13fba7;
                                  puVar18[-1] = 0;
                                  uVar6 = FStar_UInt32_eq_mask(uVar9,0xf);
                                  if (uVar19 != 0) {
                                    uVar11 = 0;
                                    do {
                                      puVar18[uVar11] =
                                           puVar18[uVar11] & ~uVar6 | local_90[uVar11] & uVar6;
                                      uVar11 = uVar11 + 1;
                                    } while (uVar19 != uVar11);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar6 = os._4_4_;
      puVar1 = ctx_n;
      puVar20 = local_48;
      puVar18[-2] = 0x13fbf2;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar19,puVar20,uVar6,puVar1,puVar18,puVar1);
      uVar17 = (int)local_60 + 1;
      uVar12 = (ulong)uVar17;
    } while (uVar17 != (uint)local_70);
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_consttime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len1; i++)
      {
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aMc[i]);
        resM[i] = resM[i] ^ dummy;
        aMc[i] = aMc[i] ^ dummy;
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, aMc, resM, aMc);
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    for (uint32_t i = 0U; i < len1; i++)
    {
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aMc[i]);
      resM[i] = resM[i] ^ dummy;
      aMc[i] = aMc[i] ^ dummy;
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i0 = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
      memcpy(resM, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = resM;
          uint32_t x = (c & res_j[i]) | (~c & resM[i]);
          os[i] = x;
        });
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
    {
      KRML_MAYBE_FOR4(i,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i0 - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      memcpy(tmp0, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = tmp0;
          uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
          os[i] = x;
        });
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}